

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

TPZSkylMatrix<double> * __thiscall
TPZSkylMatrix<double>::operator*=(TPZSkylMatrix<double> *this,double value)

{
  _func_int **pp_Var1;
  double **ppdVar2;
  double *pdVar3;
  int iVar4;
  int extraout_var;
  double *pdVar5;
  long lVar6;
  
  pp_Var1 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
  if (1e-12 <= ABS(value)) {
    iVar4 = (*pp_Var1[0xc])();
    if (CONCAT44(extraout_var,iVar4) != 0 && -1 < extraout_var) {
      ppdVar2 = (this->fElem).fStore;
      lVar6 = 0;
      pdVar5 = *ppdVar2;
      do {
        pdVar3 = ppdVar2[lVar6 + 1];
        for (; pdVar5 < pdVar3; pdVar5 = pdVar5 + 1) {
          *pdVar5 = *pdVar5 * value;
        }
        lVar6 = lVar6 + 1;
        pdVar5 = pdVar3;
      } while (lVar6 != CONCAT44(extraout_var,iVar4));
    }
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  }
  else {
    (*pp_Var1[0xf])();
  }
  return this;
}

Assistant:

TPZSkylMatrix<TVar> &
TPZSkylMatrix<TVar>::operator*=(const TVar value )
{
	if ( IsZero( value ) )
    {
		Zero();
		return( *this );
    }
	
	int64_t col, colmax = this->Dim();
	for (col=0; col<colmax; col++ )
    {
		// Efetua a MULTIPLICACAO.
		TVar *elem = fElem[col];
		TVar *end  = fElem[col+1];
		while ( elem < end ) *elem++ *= value;
    }
	
	this->fDecomposed = 0;
	return( *this );
}